

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_api.c
# Opt level: O1

MPP_RET free_cur_ctx(H264dCurCtx_t *p_Cur)

{
  RK_U8 *pRVar1;
  MPP_RET extraout_EAX;
  MPP_RET extraout_EAX_00;
  MPP_RET extraout_EAX_01;
  MPP_RET MVar2;
  MPP_RET extraout_EAX_02;
  undefined8 in_RAX;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 extraout_RAX_02;
  undefined8 extraout_RAX_03;
  undefined8 extraout_RAX_04;
  long lVar3;
  
  if (p_Cur != (H264dCurCtx_t *)0x0) {
    lVar3 = 0;
    do {
      if (p_Cur->listP[lVar3] != (h264_store_pic_t **)0x0) {
        mpp_osal_free("free_cur_ctx",p_Cur->listP[lVar3]);
        in_RAX = extraout_RAX;
      }
      p_Cur->listP[lVar3] = (h264_store_pic_t **)0x0;
      if (p_Cur->listB[lVar3] != (h264_store_pic_t **)0x0) {
        mpp_osal_free("free_cur_ctx",p_Cur->listB[lVar3]);
        in_RAX = extraout_RAX_00;
      }
      p_Cur->listB[lVar3] = (h264_store_pic_t **)0x0;
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    pRVar1 = (p_Cur->strm).nalu_buf;
    if (pRVar1 != (RK_U8 *)0x0) {
      mpp_osal_free("free_cur_ctx",pRVar1);
      in_RAX = extraout_RAX_01;
    }
    (p_Cur->strm).nalu_buf = (RK_U8 *)0x0;
    pRVar1 = (p_Cur->strm).head_buf;
    if (pRVar1 != (RK_U8 *)0x0) {
      mpp_osal_free("free_cur_ctx",pRVar1);
      in_RAX = extraout_RAX_02;
    }
    (p_Cur->strm).head_buf = (RK_U8 *)0x0;
    pRVar1 = (p_Cur->strm).tmp_buf;
    if (pRVar1 != (RK_U8 *)0x0) {
      mpp_osal_free("free_cur_ctx",pRVar1);
      in_RAX = extraout_RAX_03;
    }
    (p_Cur->strm).tmp_buf = (RK_U8 *)0x0;
    lVar3 = 0;
    do {
      if (p_Cur->dec_ref_pic_marking_buffer[lVar3] != (h264_drpm_t *)0x0) {
        mpp_osal_free("free_cur_ctx",p_Cur->dec_ref_pic_marking_buffer[lVar3]);
        in_RAX = extraout_RAX_04;
      }
      MVar2 = (MPP_RET)in_RAX;
      p_Cur->dec_ref_pic_marking_buffer[lVar3] = (h264_drpm_t *)0x0;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x23);
    if (p_Cur->subsps != (h264_subsps_t *)0x0) {
      mpp_osal_free("free_cur_ctx",p_Cur->subsps);
      MVar2 = extraout_EAX;
    }
    p_Cur->subsps = (h264_subsps_t *)0x0;
    if (p_Cur->sei != (h264_sei_t *)0x0) {
      mpp_osal_free("free_cur_ctx",p_Cur->sei);
      MVar2 = extraout_EAX_00;
    }
    p_Cur->sei = (h264_sei_t *)0x0;
    if (p_Cur->hdr_dynamic_meta != (MppFrameHdrDynamicMeta *)0x0) {
      mpp_osal_free("free_cur_ctx",p_Cur->hdr_dynamic_meta);
      MVar2 = extraout_EAX_01;
    }
    p_Cur->hdr_dynamic_meta = (MppFrameHdrDynamicMeta *)0x0;
    return MVar2;
  }
  if (((byte)h264d_debug & 4) == 0) {
    return 0x2feca8;
  }
  _mpp_log_l(4,"h264d_api","input empty(%d).\n",(char *)0x0,0x52);
  return extraout_EAX_02;
}

Assistant:

static MPP_RET free_cur_ctx(H264dCurCtx_t *p_Cur)
{
    RK_U32 i = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;

    INP_CHECK(ret, !p_Cur);

    if (p_Cur) {
        for (i = 0; i < MAX_NUM_DPB_LAYERS; i++) {
            MPP_FREE(p_Cur->listP[i]);
            MPP_FREE(p_Cur->listB[i]);
        }
        MPP_FREE(p_Cur->strm.nalu_buf);
        MPP_FREE(p_Cur->strm.head_buf);
        MPP_FREE(p_Cur->strm.tmp_buf);

        for (i = 0; i < MAX_MARKING_TIMES; i++)
            MPP_FREE(p_Cur->dec_ref_pic_marking_buffer[i]);

        MPP_FREE(p_Cur->subsps);
        MPP_FREE(p_Cur->sei);
        MPP_FREE(p_Cur->hdr_dynamic_meta);
    }

__RETURN:
    return ret = MPP_OK;
}